

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O0

ares_status_t ares_uri_set_scheme(ares_uri_t *uri,char *scheme)

{
  ares_bool_t aVar1;
  char *scheme_local;
  ares_uri_t *uri_local;
  
  if (uri == (ares_uri_t *)0x0) {
    uri_local._4_4_ = ARES_EFORMERR;
  }
  else {
    aVar1 = ares_uri_scheme_is_valid(scheme);
    if (aVar1 == ARES_FALSE) {
      uri_local._4_4_ = ARES_EBADSTR;
    }
    else {
      ares_strcpy(uri->scheme,scheme,0x10);
      ares_str_lower(uri->scheme);
      uri_local._4_4_ = ARES_SUCCESS;
    }
  }
  return uri_local._4_4_;
}

Assistant:

ares_status_t ares_uri_set_scheme(ares_uri_t *uri, const char *scheme)
{
  if (uri == NULL) {
    return ARES_EFORMERR;
  }

  if (!ares_uri_scheme_is_valid(scheme)) {
    return ARES_EBADSTR;
  }

  ares_strcpy(uri->scheme, scheme, sizeof(uri->scheme));
  ares_str_lower(uri->scheme);

  return ARES_SUCCESS;
}